

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

bool __thiscall
gguf_reader::read<short>(gguf_reader *this,vector<short,_std::allocator<short>_> *dst,size_t n)

{
  bool bVar1;
  short *psVar2;
  vector<short,_std::allocator<short>_> *in_RSI;
  vector<short,_std::allocator<short>_> *in_RDI;
  size_t i;
  short *dst_00;
  short *local_28;
  
  std::vector<short,_std::allocator<short>_>::resize(in_RDI,(size_type)in_RSI);
  local_28 = (short *)0x0;
  while( true ) {
    dst_00 = local_28;
    psVar2 = (short *)std::vector<short,_std::allocator<short>_>::size(in_RSI);
    if (psVar2 <= dst_00) {
      return true;
    }
    std::vector<short,_std::allocator<short>_>::operator[](in_RSI,(size_type)local_28);
    bVar1 = read<short>((gguf_reader *)in_RDI,dst_00);
    if (!bVar1) break;
    local_28 = (short *)((long)local_28 + 1);
  }
  return false;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }